

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncproto.h
# Opt level: O2

void __thiscall SQFunctionProto::Finalize(SQFunctionProto *this)

{
  long lVar1;
  SQInteger _n_;
  long lVar2;
  
  lVar1 = 0;
  for (lVar2 = 0; lVar2 < this->_nliterals; lVar2 = lVar2 + 1) {
    SQObjectPtr::Null((SQObjectPtr *)((long)&(this->_literals->super_SQObject)._type + lVar1));
    lVar1 = lVar1 + 0x10;
  }
  return;
}

Assistant:

void Finalize(){ _NULL_SQOBJECT_VECTOR(_literals,_nliterals); }